

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cffload.c
# Opt level: O0

FT_Error cff_font_load(FT_Library library,FT_Stream stream,FT_Int face_index,CFF_Font_conflict font,
                      CFF_Face face,FT_Bool pure_cff,FT_Bool cff2)

{
  FT_Memory memory_00;
  FT_UInt16 FVar1;
  FT_ULong base_offset_00;
  FT_ULong FVar2;
  FT_Pointer pvVar3;
  FT_String *pFVar4;
  FT_UInt FVar5;
  bool local_e6;
  uint local_e4;
  FT_Bool invert;
  FT_UInt idx;
  CFF_SubFont sub;
  CFF_IndexRec fd_index;
  undefined1 local_90 [3];
  FT_Byte absolute_offset;
  FT_UInt subfont_index;
  CFF_IndexRec string_index;
  CFF_FontRecDict dict;
  FT_ULong base_offset;
  FT_Memory memory;
  FT_Error error;
  FT_Bool pure_cff_local;
  CFF_Face face_local;
  CFF_Font_conflict font_local;
  FT_Stream pFStack_18;
  FT_Int face_index_local;
  FT_Stream stream_local;
  FT_Library library_local;
  
  memory_00 = stream->memory;
  memory._7_1_ = pure_cff;
  _error = face;
  face_local = (CFF_Face)font;
  font_local._4_4_ = face_index;
  pFStack_18 = stream;
  stream_local = (FT_Stream)library;
  memset(font,0,0x13c0);
  memset(local_90,0,0x40);
  string_index.bytes = (FT_Byte *)&face_local[1].root.size;
  base_offset_00 = FT_Stream_Pos(pFStack_18);
  (face_local->root).num_faces = (FT_Long)stream_local;
  (face_local->root).face_index = (FT_Long)pFStack_18;
  (face_local->root).face_flags = (FT_Long)memory_00;
  *(FT_Bool *)&(face_local->root).style_name = cff2;
  (face_local->root).style_flags = base_offset_00;
  memory._0_4_ = FT_Stream_ReadFields(pFStack_18,cff_font_load::cff_header_fields,face_local);
  if ((int)memory != 0) goto LAB_002f54b6;
  if (cff2 == '\0') {
    fd_index.bytes._3_1_ = FT_Stream_ReadByte(pFStack_18,(FT_Error *)&memory);
    if ((int)memory != 0) goto LAB_002f54b6;
    if (((*(char *)&(face_local->root).family_name != '\x01') ||
        (*(byte *)((long)&(face_local->root).family_name + 2) < 4)) || (4 < fd_index.bytes._3_1_)) {
      memory._0_4_ = 2;
      goto LAB_002f54b6;
    }
  }
  else {
    if ((*(char *)&(face_local->root).family_name != '\x02') ||
       (*(byte *)((long)&(face_local->root).family_name + 2) < 5)) {
      memory._0_4_ = 2;
      goto LAB_002f54b6;
    }
    FVar1 = FT_Stream_ReadUShort(pFStack_18,(FT_Error *)&memory);
    *(uint *)((long)&(face_local->root).family_name + 4) = (uint)FVar1;
    if ((int)memory != 0) goto LAB_002f54b6;
  }
  memory._0_4_ = FT_Stream_Seek(pFStack_18,
                                base_offset_00 +
                                *(byte *)((long)&(face_local->root).family_name + 2));
  if ((int)memory != 0) {
    if (memory._7_1_ != '\0') {
      memory._0_4_ = 2;
    }
    goto LAB_002f54b6;
  }
  if (cff2 == '\0') {
    memory._0_4_ = cff_index_init((CFF_Index)&(face_local->root).num_fixed_sizes,pFStack_18,'\0',
                                  '\0');
    if ((int)memory != 0) {
      if (memory._7_1_ != '\0') {
        memory._0_4_ = 2;
      }
      goto LAB_002f54b6;
    }
    if ((1 < *(uint *)&(face_local->root).field_0x4c) &&
       ((face_local->root).generic.finalizer <
        (FT_Generic_Finalizer)(ulong)*(uint *)&(face_local->root).field_0x4c)) {
      memory._0_4_ = 3;
      if (memory._7_1_ != '\0') {
        memory._0_4_ = 2;
      }
      goto LAB_002f54b6;
    }
    memory._0_4_ = cff_index_init((CFF_Index)&(face_local->bdf).strings,pFStack_18,'\0','\0');
    if (((((int)memory != 0) ||
         (memory._0_4_ = cff_index_init((CFF_Index)local_90,pFStack_18,'\x01','\0'),
         (int)memory != 0)) ||
        (memory._0_4_ = cff_index_init((CFF_Index)&(face_local->root).memory,pFStack_18,'\x01','\0')
        , (int)memory != 0)) ||
       (memory._0_4_ = cff_index_get_pointers
                                 ((CFF_Index)local_90,(FT_Byte ***)&face_local[1].root.units_per_EM,
                                  (FT_Byte **)&face_local[1].root.max_advance_width,
                                  (FT_ULong *)&face_local[1].root.glyph), (int)memory != 0))
    goto LAB_002f54b6;
    if (*(uint *)&(face_local->bdf).loaded < *(uint *)&(face_local->root).field_0x4c) {
      memory._0_4_ = 3;
      goto LAB_002f54b6;
    }
  }
  else {
    memset(&(face_local->bdf).strings,0,0x40);
    FVar2 = FT_Stream_Pos(pFStack_18);
    face_local->vert_metrics_offset = FVar2;
    face_local->ebdt_start = (ulong)*(uint *)((long)&(face_local->root).family_name + 4);
    memory._0_4_ = FT_Stream_Skip(pFStack_18,
                                  (ulong)*(uint *)((long)&(face_local->root).family_name + 4));
    if (((int)memory != 0) ||
       (memory._0_4_ = cff_index_init((CFF_Index)&(face_local->root).memory,pFStack_18,'\x01',cff2),
       (int)memory != 0)) goto LAB_002f54b6;
  }
  *(undefined4 *)&face_local[1].root.bbox.yMax = string_index.start._4_4_;
  if (memory._7_1_ == '\0') {
    fd_index.bytes._4_4_ = 0;
    if (1 < *(uint *)&(face_local->root).field_0x4c) {
      memory._0_4_ = 3;
      goto LAB_002f54b6;
    }
  }
  else {
    fd_index.bytes._4_4_ = font_local._4_4_ & 0xffff;
    if ((0 < (int)font_local._4_4_) &&
       (*(uint *)&(face_local->root).field_0x4c <= fd_index.bytes._4_4_)) {
      memory._0_4_ = 6;
      goto LAB_002f54b6;
    }
    *(undefined4 *)&(face_local->root).num_glyphs = *(undefined4 *)&(face_local->root).field_0x4c;
  }
  if (-1 < (int)font_local._4_4_) {
    FVar5 = 0x1000;
    if (cff2 != '\0') {
      FVar5 = 0x3000;
    }
    memory._0_4_ = cff_subfont_load((CFF_SubFont)&face_local[1].root.size,
                                    (CFF_Index)&(face_local->bdf).strings,fd_index.bytes._4_4_,
                                    pFStack_18,base_offset_00,FVar5,(CFF_Font_conflict)face_local,
                                    _error);
    if ((((int)memory == 0) &&
        (memory._0_4_ = FT_Stream_Seek(pFStack_18,
                                       base_offset_00 + *(long *)(string_index.bytes + 0xc0)),
        (int)memory == 0)) &&
       (memory._0_4_ = cff_index_init((CFF_Index)&face_local->sbit_table_type,pFStack_18,'\0',cff2),
       (int)memory == 0)) {
      if ((*(int *)(string_index.bytes + 0xe4) == 0xffff) && (cff2 == '\0')) {
        *(undefined4 *)&face_local[1].bdf.table = 0;
        memory._0_4_ = 0;
      }
      else {
        memory._0_4_ = cff_vstore_load((CFF_VStoreRec *)&face_local[3].name_table.storageOffset,
                                       pFStack_18,base_offset_00,
                                       *(FT_ULong *)(string_index.bytes + 0x138));
        if (((int)memory != 0) ||
           ((memory._0_4_ = FT_Stream_Seek(pFStack_18,
                                           base_offset_00 + *(long *)(string_index.bytes + 0x120)),
            (int)memory != 0 ||
            (memory._0_4_ = cff_index_init((CFF_Index)&sub,pFStack_18,'\0',cff2), (int)memory != 0))
           )) goto LAB_002f54b6;
        if (fd_index.start._4_4_ < 0x101) {
          *(uint *)&face_local[1].bdf.table = fd_index.start._4_4_;
          pvVar3 = ft_mem_realloc(memory_00,0x4c8,0,(ulong)fd_index.start._4_4_,(void *)0x0,
                                  (FT_Error *)&memory);
          if ((int)memory == 0) {
            for (local_e4 = 0; local_e4 < fd_index.start._4_4_; local_e4 = local_e4 + 1) {
              (&face_local[1].bdf.table_end)[local_e4] =
                   (FT_Byte *)((long)pvVar3 + (ulong)local_e4 * 0x4c8);
            }
            for (local_e4 = 0; local_e4 < fd_index.start._4_4_; local_e4 = local_e4 + 1) {
              FVar5 = 0x1000;
              if (cff2 != '\0') {
                FVar5 = 0x4000;
              }
              memory._0_4_ = cff_subfont_load((CFF_SubFont)(&face_local[1].bdf.table_end)[local_e4],
                                              (CFF_Index)&sub,local_e4,pFStack_18,base_offset_00,
                                              FVar5,(CFF_Font_conflict)face_local,_error);
              if ((int)memory != 0) goto LAB_002f5326;
            }
            if ((cff2 == '\0') || (1 < fd_index.start._4_4_)) {
              memory._0_4_ = CFF_Load_FD_Select((CFF_FDSelect)
                                                &face_local[3].max_profile.maxFunctionDefs,
                                                *(FT_UInt *)((long)&face_local->kern_table + 4),
                                                pFStack_18,
                                                base_offset_00 +
                                                *(long *)(string_index.bytes + 0x128));
            }
          }
        }
LAB_002f5326:
        cff_index_done((CFF_Index)&sub);
        if ((int)memory != 0) goto LAB_002f54b6;
      }
      if (*(long *)(string_index.bytes + 0xc0) == 0) {
        memory._0_4_ = 3;
      }
      else {
        *(undefined4 *)((long)&(face_local->root).num_glyphs + 4) =
             *(undefined4 *)((long)&face_local->kern_table + 4);
        memory._0_4_ = cff_index_get_pointers
                                 ((CFF_Index)&(face_local->root).memory,
                                  (FT_Byte ***)&face_local[1].root.bbox.xMax,(FT_Byte **)0x0,
                                  (FT_ULong *)0x0);
        if ((int)memory == 0) {
          if ((cff2 == '\0') && (*(int *)((long)&(face_local->root).num_glyphs + 4) != 0)) {
            local_e6 = *(int *)(string_index.bytes + 0xe4) != 0xffff && memory._7_1_ != '\0';
            memory._0_4_ = cff_charset_load((CFF_Charset)&face_local->hdmx_record_count,
                                            *(FT_UInt *)((long)&(face_local->root).num_glyphs + 4),
                                            pFStack_18,base_offset_00,
                                            *(FT_ULong *)(string_index.bytes + 0xb0),local_e6);
            if (((int)memory != 0) ||
               ((*(int *)(string_index.bytes + 0xe4) == 0xffff &&
                (memory._0_4_ = cff_encoding_load((CFF_Encoding)&face_local->ttc_header,
                                                  (CFF_Charset)&face_local->hdmx_record_count,
                                                  *(FT_UInt *)
                                                   ((long)&(face_local->root).num_glyphs + 4),
                                                  pFStack_18,base_offset_00,
                                                  *(FT_ULong *)(string_index.bytes + 0xb8)),
                (int)memory != 0)))) goto LAB_002f54b6;
          }
          pFVar4 = cff_index_get_name((CFF_Font_conflict)face_local,fd_index.bytes._4_4_);
          face_local[1].root.bbox.yMin = (FT_Pos)pFVar4;
        }
      }
    }
  }
LAB_002f54b6:
  cff_index_done((CFF_Index)local_90);
  return (int)memory;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  cff_font_load( FT_Library library,
                 FT_Stream  stream,
                 FT_Int     face_index,
                 CFF_Font   font,
                 CFF_Face   face,
                 FT_Bool    pure_cff,
                 FT_Bool    cff2 )
  {
    static const FT_Frame_Field  cff_header_fields[] =
    {
#undef  FT_STRUCTURE
#define FT_STRUCTURE  CFF_FontRec

      FT_FRAME_START( 3 ),
        FT_FRAME_BYTE( version_major ),
        FT_FRAME_BYTE( version_minor ),
        FT_FRAME_BYTE( header_size ),
      FT_FRAME_END
    };

    FT_Error         error;
    FT_Memory        memory = stream->memory;
    FT_ULong         base_offset;
    CFF_FontRecDict  dict;
    CFF_IndexRec     string_index;
    FT_UInt          subfont_index;


    FT_ZERO( font );
    FT_ZERO( &string_index );

    dict        = &font->top_font.font_dict;
    base_offset = FT_STREAM_POS();

    font->library     = library;
    font->stream      = stream;
    font->memory      = memory;
    font->cff2        = cff2;
    font->base_offset = base_offset;

    /* read CFF font header */
    if ( FT_STREAM_READ_FIELDS( cff_header_fields, font ) )
      goto Exit;

    if ( cff2 )
    {
      if ( font->version_major != 2 ||
           font->header_size < 5    )
      {
        FT_TRACE2(( "  not a CFF2 font header\n" ));
        error = FT_THROW( Unknown_File_Format );
        goto Exit;
      }

      if ( FT_READ_USHORT( font->top_dict_length ) )
        goto Exit;
    }
    else
    {
      FT_Byte  absolute_offset;


      if ( FT_READ_BYTE( absolute_offset ) )
        goto Exit;

      if ( font->version_major != 1 ||
           font->header_size < 4    ||
           absolute_offset > 4      )
      {
        FT_TRACE2(( "  not a CFF font header\n" ));
        error = FT_THROW( Unknown_File_Format );
        goto Exit;
      }
    }

    /* skip the rest of the header */
    if ( FT_STREAM_SEEK( base_offset + font->header_size ) )
    {
      /* For pure CFFs we have read only four bytes so far.  Contrary to */
      /* other formats like SFNT those bytes doesn't define a signature; */
      /* it is thus possible that the font isn't a CFF at all.           */
      if ( pure_cff )
      {
        FT_TRACE2(( "  not a CFF file\n" ));
        error = FT_THROW( Unknown_File_Format );
      }
      goto Exit;
    }

    if ( cff2 )
    {
      /* For CFF2, the top dict data immediately follow the header    */
      /* and the length is stored in the header `offSize' field;      */
      /* there is no index for it.                                    */
      /*                                                              */
      /* Use the `font_dict_index' to save the current position       */
      /* and length of data, but leave count at zero as an indicator. */
      FT_ZERO( &font->font_dict_index );

      font->font_dict_index.data_offset = FT_STREAM_POS();
      font->font_dict_index.data_size   = font->top_dict_length;

      /* skip the top dict data for now, we will parse it later */
      if ( FT_STREAM_SKIP( font->top_dict_length ) )
        goto Exit;

      /* next, read the global subrs index */
      if ( FT_SET_ERROR( cff_index_init( &font->global_subrs_index,
                                         stream, 1, cff2 ) ) )
        goto Exit;
    }
    else
    {
      /* for CFF, read the name, top dict, string and global subrs index */
      if ( FT_SET_ERROR( cff_index_init( &font->name_index,
                                         stream, 0, cff2 ) ) )
      {
        if ( pure_cff )
        {
          FT_TRACE2(( "  not a CFF file\n" ));
          error = FT_THROW( Unknown_File_Format );
        }
        goto Exit;
      }

      /* if we have an empty font name,      */
      /* it must be the only font in the CFF */
      if ( font->name_index.count > 1                          &&
           font->name_index.data_size < font->name_index.count )
      {
        /* for pure CFFs, we still haven't checked enough bytes */
        /* to be sure that it is a CFF at all                   */
        error = pure_cff ? FT_THROW( Unknown_File_Format )
                         : FT_THROW( Invalid_File_Format );
        goto Exit;
      }

      if ( FT_SET_ERROR( cff_index_init( &font->font_dict_index,
                                         stream, 0, cff2 ) )                 ||
           FT_SET_ERROR( cff_index_init( &string_index,
                                         stream, 1, cff2 ) )                 ||
           FT_SET_ERROR( cff_index_init( &font->global_subrs_index,
                                         stream, 1, cff2 ) )                 ||
           FT_SET_ERROR( cff_index_get_pointers( &string_index,
                                                 &font->strings,
                                                 &font->string_pool,
                                                 &font->string_pool_size ) ) )
        goto Exit;

      /* there must be a Top DICT index entry for each name index entry */
      if ( font->name_index.count > font->font_dict_index.count )
      {
        FT_ERROR(( "cff_font_load:"
                   " not enough entries in Top DICT index\n" ));
        error = FT_THROW( Invalid_File_Format );
        goto Exit;
      }
    }

    font->num_strings = string_index.count;

    if ( pure_cff )
    {
      /* well, we don't really forget the `disabled' fonts... */
      subfont_index = (FT_UInt)( face_index & 0xFFFF );

      if ( face_index > 0 && subfont_index >= font->name_index.count )
      {
        FT_ERROR(( "cff_font_load:"
                   " invalid subfont index for pure CFF font (%d)\n",
                   subfont_index ));
        error = FT_THROW( Invalid_Argument );
        goto Exit;
      }

      font->num_faces = font->name_index.count;
    }
    else
    {
      subfont_index = 0;

      if ( font->name_index.count > 1 )
      {
        FT_ERROR(( "cff_font_load:"
                   " invalid CFF font with multiple subfonts\n" ));
        FT_ERROR(( "              "
                   " in SFNT wrapper\n" ));
        error = FT_THROW( Invalid_File_Format );
        goto Exit;
      }
    }

    /* in case of a font format check, simply exit now */
    if ( face_index < 0 )
      goto Exit;

    /* now, parse the top-level font dictionary */
    FT_TRACE4(( "parsing top-level\n" ));
    error = cff_subfont_load( &font->top_font,
                              &font->font_dict_index,
                              subfont_index,
                              stream,
                              base_offset,
                              cff2 ? CFF2_CODE_TOPDICT : CFF_CODE_TOPDICT,
                              font,
                              face );
    if ( error )
      goto Exit;

    if ( FT_STREAM_SEEK( base_offset + dict->charstrings_offset ) )
      goto Exit;

    error = cff_index_init( &font->charstrings_index, stream, 0, cff2 );
    if ( error )
      goto Exit;

    /* now, check for a CID or CFF2 font */
    if ( dict->cid_registry != 0xFFFFU ||
         cff2                          )
    {
      CFF_IndexRec  fd_index;
      CFF_SubFont   sub = NULL;
      FT_UInt       idx;


      /* for CFF2, read the Variation Store if available;                 */
      /* this must follow the Top DICT parse and precede any Private DICT */
      error = cff_vstore_load( &font->vstore,
                               stream,
                               base_offset,
                               dict->vstore_offset );
      if ( error )
        goto Exit;

      /* this is a CID-keyed font, we must now allocate a table of */
      /* sub-fonts, then load each of them separately              */
      if ( FT_STREAM_SEEK( base_offset + dict->cid_fd_array_offset ) )
        goto Exit;

      error = cff_index_init( &fd_index, stream, 0, cff2 );
      if ( error )
        goto Exit;

      /* Font Dicts are not limited to 256 for CFF2. */
      /* TODO: support this for CFF2                 */
      if ( fd_index.count > CFF_MAX_CID_FONTS )
      {
        FT_TRACE0(( "cff_font_load: FD array too large in CID font\n" ));
        goto Fail_CID;
      }

      /* allocate & read each font dict independently */
      font->num_subfonts = fd_index.count;
      if ( FT_NEW_ARRAY( sub, fd_index.count ) )
        goto Fail_CID;

      /* set up pointer table */
      for ( idx = 0; idx < fd_index.count; idx++ )
        font->subfonts[idx] = sub + idx;

      /* now load each subfont independently */
      for ( idx = 0; idx < fd_index.count; idx++ )
      {
        sub = font->subfonts[idx];
        FT_TRACE4(( "parsing subfont %u\n", idx ));
        error = cff_subfont_load( sub,
                                  &fd_index,
                                  idx,
                                  stream,
                                  base_offset,
                                  cff2 ? CFF2_CODE_FONTDICT
                                       : CFF_CODE_TOPDICT,
                                  font,
                                  face );
        if ( error )
          goto Fail_CID;
      }

      /* now load the FD Select array;               */
      /* CFF2 omits FDSelect if there is only one FD */
      if ( !cff2 || fd_index.count > 1 )
        error = CFF_Load_FD_Select( &font->fd_select,
                                    font->charstrings_index.count,
                                    stream,
                                    base_offset + dict->cid_fd_select_offset );

    Fail_CID:
      cff_index_done( &fd_index );

      if ( error )
        goto Exit;
    }
    else
      font->num_subfonts = 0;

    /* read the charstrings index now */
    if ( dict->charstrings_offset == 0 )
    {
      FT_ERROR(( "cff_font_load: no charstrings offset\n" ));
      error = FT_THROW( Invalid_File_Format );
      goto Exit;
    }

    font->num_glyphs = font->charstrings_index.count;

    error = cff_index_get_pointers( &font->global_subrs_index,
                                    &font->global_subrs, NULL, NULL );

    if ( error )
      goto Exit;

    /* read the Charset and Encoding tables if available */
    if ( !cff2 && font->num_glyphs > 0 )
    {
      FT_Bool  invert = FT_BOOL( dict->cid_registry != 0xFFFFU && pure_cff );


      error = cff_charset_load( &font->charset, font->num_glyphs, stream,
                                base_offset, dict->charset_offset, invert );
      if ( error )
        goto Exit;

      /* CID-keyed CFFs don't have an encoding */
      if ( dict->cid_registry == 0xFFFFU )
      {
        error = cff_encoding_load( &font->encoding,
                                   &font->charset,
                                   font->num_glyphs,
                                   stream,
                                   base_offset,
                                   dict->encoding_offset );
        if ( error )
          goto Exit;
      }
    }

    /* get the font name (/CIDFontName for CID-keyed fonts, */
    /* /FontName otherwise)                                 */
    font->font_name = cff_index_get_name( font, subfont_index );

  Exit:
    cff_index_done( &string_index );

    return error;
  }